

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O2

QTextList * __thiscall QTextCursor::createList(QTextCursor *this,QTextListFormat *format)

{
  int o;
  QTextCursorPrivate *pQVar1;
  QTextObject *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d).d.ptr != (QTextCursorPrivate *)0x0) {
    pQVar1 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
    if (pQVar1->priv != (QTextDocumentPrivate *)0x0) {
      pQVar1 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
      this_00 = QTextDocumentPrivate::createObject(pQVar1->priv,&format->super_QTextFormat,-1);
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)local_38);
      o = QTextObject::objectIndex(this_00);
      QTextFormat::setObjectIndex((QTextFormat *)local_38,o);
      mergeBlockFormat(this,(QTextBlockFormat *)local_38);
      QTextFormat::~QTextFormat((QTextFormat *)local_38);
      goto LAB_0044df4f;
    }
  }
  this_00 = (QTextObject *)0x0;
LAB_0044df4f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QTextList *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QTextList *QTextCursor::createList(const QTextListFormat &format)
{
    if (!d || !d->priv)
        return nullptr;

    QTextList *list = static_cast<QTextList *>(d->priv->createObject(format));
    QTextBlockFormat modifier;
    modifier.setObjectIndex(list->objectIndex());
    mergeBlockFormat(modifier);
    return list;
}